

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleUpdatePrePartialsByPartition
              (int instance,BeagleOperationByPartition *operations,int operationCount)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0xf0))
                      (pBVar2,operations,operationCount,*(code **)(*(long *)pBVar2 + 0xf0));
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleUpdatePrePartialsByPartition(const int instance,
                                       const BeagleOperationByPartition* operations,
                                       int operationCount) {
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->updatePrePartialsByPartition((const int*)operations, operationCount);
    DEBUG_END_TIME();
    return returnValue;
}